

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 count,ma_uint8 riceParam,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pSamplesOut)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ma_bool32 mVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  byte in_CL;
  byte bVar13;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  ma_uint32 i;
  ma_int32 *pSamplesOutEnd;
  ma_uint32 riceParamMask;
  ma_uint32 riceParamPart3;
  ma_uint32 riceParamPart2;
  ma_uint32 riceParamPart1;
  ma_uint32 riceParamPart0;
  ma_uint32 zeroCountPart3;
  ma_uint32 zeroCountPart2;
  ma_uint32 zeroCountPart1;
  ma_uint32 zeroCountPart0;
  ma_uint32 t [2];
  ma_uint32 zeroCounter_8;
  ma_uint32 riceParamPartLoBitCount_8;
  ma_uint32 riceParamPartLo_8;
  ma_uint32 riceParamPartHi_8;
  ma_uint32 lzcount_8;
  ma_uint32 bs_consumedBits_8;
  ma_dr_flac_cache_t bs_cache_8;
  ma_uint32 riceParamPlus1MaxConsumedBits_8;
  ma_uint32 riceParamPlus1Shift_8;
  ma_uint32 riceParamPlus1_8;
  ma_uint64 r_16;
  ma_uint64 r_17;
  ma_uint32 n_16;
  ma_uint32 n_17;
  ma_uint32 zeroCounter_7;
  ma_uint32 riceParamPartLoBitCount_7;
  ma_uint32 riceParamPartLo_7;
  ma_uint32 riceParamPartHi_7;
  ma_uint32 lzcount_7;
  ma_uint32 bs_consumedBits_7;
  ma_dr_flac_cache_t bs_cache_7;
  ma_uint32 riceParamPlus1MaxConsumedBits_7;
  ma_uint32 riceParamPlus1Shift_7;
  ma_uint32 riceParamPlus1_7;
  ma_uint64 r_14;
  ma_uint64 r_15;
  ma_uint32 n_14;
  ma_uint32 n_15;
  ma_uint32 zeroCounter_6;
  ma_uint32 riceParamPartLoBitCount_6;
  ma_uint32 riceParamPartLo_6;
  ma_uint32 riceParamPartHi_6;
  ma_uint32 lzcount_6;
  ma_uint32 bs_consumedBits_6;
  ma_dr_flac_cache_t bs_cache_6;
  ma_uint32 riceParamPlus1MaxConsumedBits_6;
  ma_uint32 riceParamPlus1Shift_6;
  ma_uint32 riceParamPlus1_6;
  ma_uint64 r_12;
  ma_uint64 r_13;
  ma_uint32 n_12;
  ma_uint32 n_13;
  ma_uint32 zeroCounter_5;
  ma_uint32 riceParamPartLoBitCount_5;
  ma_uint32 riceParamPartLo_5;
  ma_uint32 riceParamPartHi_5;
  ma_uint32 lzcount_5;
  ma_uint32 bs_consumedBits_5;
  ma_dr_flac_cache_t bs_cache_5;
  ma_uint32 riceParamPlus1MaxConsumedBits_5;
  ma_uint32 riceParamPlus1Shift_5;
  ma_uint32 riceParamPlus1_5;
  ma_uint64 r_10;
  ma_uint64 r_11;
  ma_uint32 n_10;
  ma_uint32 n_11;
  ma_uint32 zeroCounter_4;
  ma_uint32 riceParamPartLoBitCount_4;
  ma_uint32 riceParamPartLo_4;
  ma_uint32 riceParamPartHi_4;
  ma_uint32 lzcount_4;
  ma_uint32 bs_consumedBits_4;
  ma_dr_flac_cache_t bs_cache_4;
  ma_uint32 riceParamPlus1MaxConsumedBits_4;
  ma_uint32 riceParamPlus1Shift_4;
  ma_uint32 riceParamPlus1_4;
  ma_uint64 r_8;
  ma_uint64 r_9;
  ma_uint32 n_8;
  ma_uint32 n_9;
  ma_uint32 zeroCounter_3;
  ma_uint32 riceParamPartLoBitCount_3;
  ma_uint32 riceParamPartLo_3;
  ma_uint32 riceParamPartHi_3;
  ma_uint32 lzcount_3;
  ma_uint32 bs_consumedBits_3;
  ma_dr_flac_cache_t bs_cache_3;
  ma_uint32 riceParamPlus1MaxConsumedBits_3;
  ma_uint32 riceParamPlus1Shift_3;
  ma_uint32 riceParamPlus1_3;
  ma_uint64 r_6;
  ma_uint64 r_7;
  ma_uint32 n_6;
  ma_uint32 n_7;
  ma_uint32 zeroCounter_2;
  ma_uint32 riceParamPartLoBitCount_2;
  ma_uint32 riceParamPartLo_2;
  ma_uint32 riceParamPartHi_2;
  ma_uint32 lzcount_2;
  ma_uint32 bs_consumedBits_2;
  ma_dr_flac_cache_t bs_cache_2;
  ma_uint32 riceParamPlus1MaxConsumedBits_2;
  ma_uint32 riceParamPlus1Shift_2;
  ma_uint32 riceParamPlus1_2;
  ma_uint64 r_4;
  ma_uint64 r_5;
  ma_uint32 n_4;
  ma_uint32 n_5;
  ma_uint32 zeroCounter_1;
  ma_uint32 riceParamPartLoBitCount_1;
  ma_uint32 riceParamPartLo_1;
  ma_uint32 riceParamPartHi_1;
  ma_uint32 lzcount_1;
  ma_uint32 bs_consumedBits_1;
  ma_dr_flac_cache_t bs_cache_1;
  ma_uint32 riceParamPlus1MaxConsumedBits_1;
  ma_uint32 riceParamPlus1Shift_1;
  ma_uint32 riceParamPlus1_1;
  ma_uint64 r_2;
  ma_uint64 r_3;
  ma_uint32 n_2;
  ma_uint32 n_3;
  ma_uint32 zeroCounter;
  ma_uint32 riceParamPartLoBitCount;
  ma_uint32 riceParamPartLo;
  ma_uint32 riceParamPartHi;
  ma_uint32 lzcount;
  ma_uint32 bs_consumedBits;
  ma_dr_flac_cache_t bs_cache;
  ma_uint32 riceParamPlus1MaxConsumedBits;
  ma_uint32 riceParamPlus1Shift;
  ma_uint32 riceParamPlus1;
  ma_uint64 r;
  ma_uint64 r_1;
  ma_uint32 n;
  ma_uint32 n_1;
  ma_int64 prediction_8;
  ma_int64 prediction_3;
  ma_int64 prediction_2;
  ma_int64 prediction_1;
  ma_int64 prediction;
  ma_int32 prediction_9;
  ma_int32 prediction_7;
  ma_int32 prediction_6;
  ma_int32 prediction_5;
  ma_int32 prediction_4;
  ma_uint32 result;
  ma_uint32 result_1;
  ma_dr_flac_bs *in_stack_ffffffffffffed30;
  ma_int32 in_stack_ffffffffffffed54;
  undefined8 in_stack_ffffffffffffed58;
  ma_uint32 in_stack_ffffffffffffed60;
  ma_uint32 in_stack_ffffffffffffed64;
  ma_dr_flac_bs *in_stack_ffffffffffffed68;
  uint local_1184;
  uint local_1174;
  uint local_1170;
  uint local_116c;
  uint local_1168;
  uint local_1164;
  uint local_1160;
  uint local_115c;
  uint local_1158;
  uint local_1154 [4];
  byte local_1141;
  uint local_1140;
  int local_113c;
  long local_1138;
  ma_bool32 local_112c;
  uint local_1124;
  int local_1120;
  uint local_1110;
  uint local_110c;
  uint local_1108;
  uint local_1104;
  uint local_1100;
  uint local_10fc;
  ulong local_10f8;
  uint local_10ec;
  int local_10e8;
  int local_10e4;
  uint *local_10e0;
  uint *local_10d8;
  byte local_10c9;
  long local_10c8;
  undefined4 in_stack_ffffffffffffef40;
  bool bVar14;
  undefined4 in_stack_ffffffffffffef44;
  ma_int32 *in_stack_ffffffffffffef48;
  uint local_107c;
  uint local_106c;
  ushort local_102e;
  ushort local_101a;
  int local_f74;
  ulong local_f70;
  uint local_f68;
  int local_f64;
  ulong local_f60;
  uint local_f54;
  uint local_f50;
  uint local_f40;
  uint local_f3c;
  ulong local_f38;
  uint local_ebc;
  uint local_eac;
  ushort local_e6e;
  ushort local_e5a;
  int local_db4;
  ulong local_db0;
  uint local_da8;
  int local_da4;
  ulong local_da0;
  uint local_d94;
  uint local_d90;
  uint local_d80;
  uint local_d7c;
  ulong local_d78;
  uint local_cfc;
  uint local_cec;
  ushort local_cae;
  ushort local_c9a;
  int local_bf4;
  ulong local_bf0;
  uint local_be8;
  int local_be4;
  ulong local_be0;
  uint local_bd4;
  uint local_bd0;
  uint local_bc0;
  uint local_bbc;
  ulong local_bb8;
  uint local_b3c;
  uint local_b2c;
  ushort local_aee;
  ushort local_ada;
  int local_a34;
  ulong local_a30;
  uint local_a28;
  int local_a24;
  ulong local_a20;
  uint local_a14;
  uint local_a10;
  uint local_a00;
  uint local_9fc;
  ulong local_9f8;
  uint local_97c;
  uint local_96c;
  ushort local_92e;
  ushort local_91a;
  int local_874;
  ulong local_870;
  uint local_868;
  int local_864;
  ulong local_860;
  uint local_854;
  uint local_850;
  uint local_840;
  uint local_83c;
  ulong local_838;
  uint local_7bc;
  uint local_7ac;
  ushort local_76e;
  ushort local_75a;
  int local_6b4;
  ulong local_6b0;
  uint local_6a8;
  int local_6a4;
  ulong local_6a0;
  uint local_694;
  uint local_690;
  uint local_680;
  uint local_67c;
  ulong local_678;
  uint local_5fc;
  uint local_5ec;
  ushort local_5ae;
  ushort local_59a;
  int local_4f4;
  ulong local_4f0;
  uint local_4e8;
  int local_4e4;
  ulong local_4e0;
  uint local_4d4;
  uint local_4d0;
  uint local_4c0;
  uint local_4bc;
  ulong local_4b8;
  uint local_43c;
  uint local_42c;
  ushort local_3ee;
  ushort local_3da;
  int local_334;
  ulong local_330;
  uint local_328;
  int local_324;
  ulong local_320;
  uint local_314;
  uint local_310;
  uint local_300;
  uint local_2fc;
  ulong local_2f8;
  uint local_27c;
  uint local_26c;
  ushort local_22e;
  ushort local_21a;
  int local_174;
  ulong local_170;
  uint local_168;
  int local_164;
  ulong local_160;
  uint local_154;
  long local_150;
  long local_130;
  long local_110;
  long local_f0;
  long local_d0;
  byte local_b4;
  int local_ac;
  int local_8c;
  int local_6c;
  int local_4c;
  int local_2c;
  byte local_18;
  int local_10;
  uint local_c;
  int local_8;
  uint local_4;
  
  local_1154[0] = 0;
  local_1154[1] = 0xffffffff;
  local_1158 = 0;
  local_115c = 0;
  local_1160 = 0;
  local_1164 = 0;
  local_1168 = 0;
  local_116c = 0;
  local_1170 = 0;
  local_1174 = 0;
  if (in_R8D == 0) {
    local_112c = ma_dr_flac__decode_samples_with_residual__rice__scalar_zeroorder
                           (in_stack_ffffffffffffed68,in_stack_ffffffffffffed64,
                            in_stack_ffffffffffffed60,
                            (ma_uint8)((ulong)in_stack_ffffffffffffed58 >> 0x38),
                            (ma_uint32)in_stack_ffffffffffffed58,in_stack_ffffffffffffed54,
                            (ma_int32 *)
                            CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                            in_stack_ffffffffffffef48);
  }
  else {
    uVar4 = (uint)(-1L << (in_CL & 0x3f)) ^ 0xffffffff;
    piVar11 = in_stack_00000018 + (in_EDX & 0xfffffffc);
    local_10 = 0;
    for (local_c = in_R8D; local_c != 0; local_c = local_c >> 1) {
      local_10 = local_10 + 1;
    }
    local_1154[2] = in_R9D;
    local_1154[3] = in_R8D;
    local_1141 = in_CL;
    local_1140 = in_EDX;
    local_113c = in_ESI;
    local_1138 = in_RDI;
    if ((uint)(in_ESI + in_stack_00000008 + local_10) < 0x21) {
      while (lVar3 = local_1138, in_stack_00000018 < piVar11) {
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_9f8 = *(ulong *)(local_1138 + 0x1030);
        local_9fc = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_9f8 == 0) {
            local_868 = 0x40;
          }
          else {
            local_874 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_9f8 >> 0x3c) * 4);
            if (local_874 == 0) {
              local_874 = 0;
              local_870 = local_9f8;
              if ((local_9f8 & 0xffffffff00000000) == 0) {
                local_874 = 0x20;
                local_870 = local_9f8 << 0x20;
              }
              if ((local_870 & 0xffff000000000000) == 0) {
                local_874 = local_874 + 0x10;
                local_870 = local_870 << 0x10;
              }
              if ((local_870 & 0xff00000000000000) == 0) {
                local_874 = local_874 + 8;
                local_870 = local_870 << 8;
              }
              if ((local_870 & 0xf000000000000000) == 0) {
                local_874 = local_874 + 4;
                local_870 = local_870 << 4;
              }
              local_874 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_870 >> 0x3c) * 4) + local_874;
            }
            local_868 = local_874 - 1;
          }
          local_96c = local_868;
        }
        else {
          local_96c = (uint)LZCOUNT(local_9f8);
        }
        local_a00 = local_96c;
        if (local_96c < 0x40) {
          local_1158 = local_96c;
          local_a10 = local_1158;
        }
        else {
          local_a10 = 0x40 - local_9fc;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_91a = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_91a = local_91a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_91a >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_91a;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_9f8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_9fc = 0;
              *(ulong *)(lVar3 + 0x1040) = local_9f8;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_00282ac5;
              }
              local_9f8 = *(ulong *)(lVar3 + 0x1030);
              local_9fc = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_860 = local_9f8;
              if (local_9f8 == 0) {
                local_854 = 0x40;
              }
              else {
                local_864 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_9f8 >> 0x3c) * 4);
                if (local_864 == 0) {
                  local_864 = 0;
                  if ((local_9f8 & 0xffffffff00000000) == 0) {
                    local_864 = 0x20;
                    local_860 = local_9f8 << 0x20;
                  }
                  if ((local_860 & 0xffff000000000000) == 0) {
                    local_864 = local_864 + 0x10;
                    local_860 = local_860 << 0x10;
                  }
                  if ((local_860 & 0xff00000000000000) == 0) {
                    local_864 = local_864 + 8;
                    local_860 = local_860 << 8;
                  }
                  if ((local_860 & 0xf000000000000000) == 0) {
                    local_864 = local_864 + 4;
                    local_860 = local_860 << 4;
                  }
                  local_864 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_860 >> 0x3c) * 4) + local_864;
                }
                local_854 = local_864 - 1;
              }
              local_97c = local_854;
            }
            else {
              local_97c = (uint)LZCOUNT(local_9f8);
            }
            local_a00 = local_97c;
            local_a10 = local_97c + local_a10;
          } while (0x3f < local_97c);
        }
        local_1158 = local_a10;
        uVar12 = local_9f8 << ((byte)local_a00 & 0x3f);
        local_a00 = local_a00 + local_9fc;
        if (0x40U - iVar5 < local_a00) {
          local_a00 = local_a00 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_92e = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_92e = local_92e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_92e >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_92e;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_9f8 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_9f8;
            local_9fc = local_a00;
LAB_00281fe4:
            local_1168 = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_9f8 >> (0x40 - (byte)local_a00 & 0x3f));
            local_9f8 = local_9f8 << ((byte)local_a00 & 0x3f);
            goto LAB_0028203b;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_a00 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_9f8 = *(ulong *)(lVar3 + 0x1030);
              local_9fc = *(int *)(lVar3 + 0x2c) + local_a00;
              goto LAB_00281fe4;
            }
            bVar14 = false;
          }
        }
        else {
          local_1168 = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_9f8 = uVar12 << ((byte)iVar5 & 0x3f);
          local_9fc = iVar5 + local_a00;
LAB_0028203b:
          *(ulong *)(lVar3 + 0x1030) = local_9f8;
          *(uint *)(lVar3 + 0x2c) = local_9fc;
          bVar14 = true;
        }
LAB_00282ac5:
        lVar3 = local_1138;
        if (!bVar14) {
          return 0;
        }
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_bb8 = *(ulong *)(local_1138 + 0x1030);
        local_bbc = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_bb8 == 0) {
            local_a28 = 0x40;
          }
          else {
            local_a34 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_bb8 >> 0x3c) * 4);
            if (local_a34 == 0) {
              local_a34 = 0;
              local_a30 = local_bb8;
              if ((local_bb8 & 0xffffffff00000000) == 0) {
                local_a34 = 0x20;
                local_a30 = local_bb8 << 0x20;
              }
              if ((local_a30 & 0xffff000000000000) == 0) {
                local_a34 = local_a34 + 0x10;
                local_a30 = local_a30 << 0x10;
              }
              if ((local_a30 & 0xff00000000000000) == 0) {
                local_a34 = local_a34 + 8;
                local_a30 = local_a30 << 8;
              }
              if ((local_a30 & 0xf000000000000000) == 0) {
                local_a34 = local_a34 + 4;
                local_a30 = local_a30 << 4;
              }
              local_a34 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_a30 >> 0x3c) * 4) + local_a34;
            }
            local_a28 = local_a34 - 1;
          }
          local_b2c = local_a28;
        }
        else {
          local_b2c = (uint)LZCOUNT(local_bb8);
        }
        local_bc0 = local_b2c;
        if (local_b2c < 0x40) {
          local_115c = local_b2c;
          local_bd0 = local_115c;
        }
        else {
          local_bd0 = 0x40 - local_bbc;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_ada = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_ada = local_ada << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_ada >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_ada;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_bb8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_bbc = 0;
              *(ulong *)(lVar3 + 0x1040) = local_bb8;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_0028417c;
              }
              local_bb8 = *(ulong *)(lVar3 + 0x1030);
              local_bbc = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_a20 = local_bb8;
              if (local_bb8 == 0) {
                local_a14 = 0x40;
              }
              else {
                local_a24 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_bb8 >> 0x3c) * 4);
                if (local_a24 == 0) {
                  local_a24 = 0;
                  if ((local_bb8 & 0xffffffff00000000) == 0) {
                    local_a24 = 0x20;
                    local_a20 = local_bb8 << 0x20;
                  }
                  if ((local_a20 & 0xffff000000000000) == 0) {
                    local_a24 = local_a24 + 0x10;
                    local_a20 = local_a20 << 0x10;
                  }
                  if ((local_a20 & 0xff00000000000000) == 0) {
                    local_a24 = local_a24 + 8;
                    local_a20 = local_a20 << 8;
                  }
                  if ((local_a20 & 0xf000000000000000) == 0) {
                    local_a24 = local_a24 + 4;
                    local_a20 = local_a20 << 4;
                  }
                  local_a24 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_a20 >> 0x3c) * 4) + local_a24;
                }
                local_a14 = local_a24 - 1;
              }
              local_b3c = local_a14;
            }
            else {
              local_b3c = (uint)LZCOUNT(local_bb8);
            }
            local_bc0 = local_b3c;
            local_bd0 = local_b3c + local_bd0;
          } while (0x3f < local_b3c);
        }
        local_115c = local_bd0;
        uVar12 = local_bb8 << ((byte)local_bc0 & 0x3f);
        local_bc0 = local_bc0 + local_bbc;
        if (0x40U - iVar5 < local_bc0) {
          local_bc0 = local_bc0 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_aee = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_aee = local_aee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_aee >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_aee;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_bb8 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_bb8;
            local_bbc = local_bc0;
LAB_0028369b:
            local_116c = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_bb8 >> (0x40 - (byte)local_bc0 & 0x3f));
            local_bb8 = local_bb8 << ((byte)local_bc0 & 0x3f);
            goto LAB_002836f2;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_bc0 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_bb8 = *(ulong *)(lVar3 + 0x1030);
              local_bbc = *(int *)(lVar3 + 0x2c) + local_bc0;
              goto LAB_0028369b;
            }
            bVar14 = false;
          }
        }
        else {
          local_116c = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_bb8 = uVar12 << ((byte)iVar5 & 0x3f);
          local_bbc = iVar5 + local_bc0;
LAB_002836f2:
          *(ulong *)(lVar3 + 0x1030) = local_bb8;
          *(uint *)(lVar3 + 0x2c) = local_bbc;
          bVar14 = true;
        }
LAB_0028417c:
        lVar3 = local_1138;
        if (!bVar14) {
          return 0;
        }
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_d78 = *(ulong *)(local_1138 + 0x1030);
        local_d7c = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_d78 == 0) {
            local_be8 = 0x40;
          }
          else {
            local_bf4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_d78 >> 0x3c) * 4);
            if (local_bf4 == 0) {
              local_bf4 = 0;
              local_bf0 = local_d78;
              if ((local_d78 & 0xffffffff00000000) == 0) {
                local_bf4 = 0x20;
                local_bf0 = local_d78 << 0x20;
              }
              if ((local_bf0 & 0xffff000000000000) == 0) {
                local_bf4 = local_bf4 + 0x10;
                local_bf0 = local_bf0 << 0x10;
              }
              if ((local_bf0 & 0xff00000000000000) == 0) {
                local_bf4 = local_bf4 + 8;
                local_bf0 = local_bf0 << 8;
              }
              if ((local_bf0 & 0xf000000000000000) == 0) {
                local_bf4 = local_bf4 + 4;
                local_bf0 = local_bf0 << 4;
              }
              local_bf4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_bf0 >> 0x3c) * 4) + local_bf4;
            }
            local_be8 = local_bf4 - 1;
          }
          local_cec = local_be8;
        }
        else {
          local_cec = (uint)LZCOUNT(local_d78);
        }
        local_d80 = local_cec;
        if (local_cec < 0x40) {
          local_1160 = local_cec;
          local_d90 = local_1160;
        }
        else {
          local_d90 = 0x40 - local_d7c;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_c9a = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_c9a = local_c9a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_c9a >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_c9a;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_d78 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_d7c = 0;
              *(ulong *)(lVar3 + 0x1040) = local_d78;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_00285833;
              }
              local_d78 = *(ulong *)(lVar3 + 0x1030);
              local_d7c = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_be0 = local_d78;
              if (local_d78 == 0) {
                local_bd4 = 0x40;
              }
              else {
                local_be4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_d78 >> 0x3c) * 4);
                if (local_be4 == 0) {
                  local_be4 = 0;
                  if ((local_d78 & 0xffffffff00000000) == 0) {
                    local_be4 = 0x20;
                    local_be0 = local_d78 << 0x20;
                  }
                  if ((local_be0 & 0xffff000000000000) == 0) {
                    local_be4 = local_be4 + 0x10;
                    local_be0 = local_be0 << 0x10;
                  }
                  if ((local_be0 & 0xff00000000000000) == 0) {
                    local_be4 = local_be4 + 8;
                    local_be0 = local_be0 << 8;
                  }
                  if ((local_be0 & 0xf000000000000000) == 0) {
                    local_be4 = local_be4 + 4;
                    local_be0 = local_be0 << 4;
                  }
                  local_be4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_be0 >> 0x3c) * 4) + local_be4;
                }
                local_bd4 = local_be4 - 1;
              }
              local_cfc = local_bd4;
            }
            else {
              local_cfc = (uint)LZCOUNT(local_d78);
            }
            local_d80 = local_cfc;
            local_d90 = local_cfc + local_d90;
          } while (0x3f < local_cfc);
        }
        local_1160 = local_d90;
        uVar12 = local_d78 << ((byte)local_d80 & 0x3f);
        local_d80 = local_d80 + local_d7c;
        if (0x40U - iVar5 < local_d80) {
          local_d80 = local_d80 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_cae = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_cae = local_cae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_cae >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_cae;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_d78 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_d78;
            local_d7c = local_d80;
LAB_00284d52:
            local_1170 = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_d78 >> (0x40 - (byte)local_d80 & 0x3f));
            local_d78 = local_d78 << ((byte)local_d80 & 0x3f);
            goto LAB_00284da9;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_d80 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_d78 = *(ulong *)(lVar3 + 0x1030);
              local_d7c = *(int *)(lVar3 + 0x2c) + local_d80;
              goto LAB_00284d52;
            }
            bVar14 = false;
          }
        }
        else {
          local_1170 = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_d78 = uVar12 << ((byte)iVar5 & 0x3f);
          local_d7c = iVar5 + local_d80;
LAB_00284da9:
          *(ulong *)(lVar3 + 0x1030) = local_d78;
          *(uint *)(lVar3 + 0x2c) = local_d7c;
          bVar14 = true;
        }
LAB_00285833:
        lVar3 = local_1138;
        if (!bVar14) {
          return 0;
        }
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_f38 = *(ulong *)(local_1138 + 0x1030);
        local_f3c = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_f38 == 0) {
            local_da8 = 0x40;
          }
          else {
            local_db4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_f38 >> 0x3c) * 4);
            if (local_db4 == 0) {
              local_db4 = 0;
              local_db0 = local_f38;
              if ((local_f38 & 0xffffffff00000000) == 0) {
                local_db4 = 0x20;
                local_db0 = local_f38 << 0x20;
              }
              if ((local_db0 & 0xffff000000000000) == 0) {
                local_db4 = local_db4 + 0x10;
                local_db0 = local_db0 << 0x10;
              }
              if ((local_db0 & 0xff00000000000000) == 0) {
                local_db4 = local_db4 + 8;
                local_db0 = local_db0 << 8;
              }
              if ((local_db0 & 0xf000000000000000) == 0) {
                local_db4 = local_db4 + 4;
                local_db0 = local_db0 << 4;
              }
              local_db4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_db0 >> 0x3c) * 4) + local_db4;
            }
            local_da8 = local_db4 - 1;
          }
          local_eac = local_da8;
        }
        else {
          local_eac = (uint)LZCOUNT(local_f38);
        }
        local_f40 = local_eac;
        if (local_eac < 0x40) {
          local_1164 = local_eac;
          local_f50 = local_1164;
        }
        else {
          local_f50 = 0x40 - local_f3c;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_e5a = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_e5a = local_e5a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_e5a >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_e5a;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_f38 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_f3c = 0;
              *(ulong *)(lVar3 + 0x1040) = local_f38;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_00286eea;
              }
              local_f38 = *(ulong *)(lVar3 + 0x1030);
              local_f3c = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_da0 = local_f38;
              if (local_f38 == 0) {
                local_d94 = 0x40;
              }
              else {
                local_da4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_f38 >> 0x3c) * 4);
                if (local_da4 == 0) {
                  local_da4 = 0;
                  if ((local_f38 & 0xffffffff00000000) == 0) {
                    local_da4 = 0x20;
                    local_da0 = local_f38 << 0x20;
                  }
                  if ((local_da0 & 0xffff000000000000) == 0) {
                    local_da4 = local_da4 + 0x10;
                    local_da0 = local_da0 << 0x10;
                  }
                  if ((local_da0 & 0xff00000000000000) == 0) {
                    local_da4 = local_da4 + 8;
                    local_da0 = local_da0 << 8;
                  }
                  if ((local_da0 & 0xf000000000000000) == 0) {
                    local_da4 = local_da4 + 4;
                    local_da0 = local_da0 << 4;
                  }
                  local_da4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_da0 >> 0x3c) * 4) + local_da4;
                }
                local_d94 = local_da4 - 1;
              }
              local_ebc = local_d94;
            }
            else {
              local_ebc = (uint)LZCOUNT(local_f38);
            }
            local_f40 = local_ebc;
            local_f50 = local_ebc + local_f50;
          } while (0x3f < local_ebc);
        }
        local_1164 = local_f50;
        uVar12 = local_f38 << ((byte)local_f40 & 0x3f);
        local_f40 = local_f40 + local_f3c;
        if (0x40U - iVar5 < local_f40) {
          local_f40 = local_f40 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_e6e = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_e6e = local_e6e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_e6e >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_e6e;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_f38 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_f38;
            local_f3c = local_f40;
LAB_00286409:
            local_1174 = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_f38 >> (0x40 - (byte)local_f40 & 0x3f));
            local_f38 = local_f38 << ((byte)local_f40 & 0x3f);
            goto LAB_00286460;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_f40 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_f38 = *(ulong *)(lVar3 + 0x1030);
              local_f3c = *(int *)(lVar3 + 0x2c) + local_f40;
              goto LAB_00286409;
            }
            bVar14 = false;
          }
        }
        else {
          local_1174 = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_f38 = uVar12 << ((byte)iVar5 & 0x3f);
          local_f3c = iVar5 + local_f40;
LAB_00286460:
          *(ulong *)(lVar3 + 0x1030) = local_f38;
          *(uint *)(lVar3 + 0x2c) = local_f3c;
          bVar14 = true;
        }
LAB_00286eea:
        if (!bVar14) {
          return 0;
        }
        uVar7 = local_1168 & uVar4 | local_1158 << (local_1141 & 0x1f);
        uVar8 = local_116c & uVar4 | local_115c << (local_1141 & 0x1f);
        uVar9 = local_1170 & uVar4 | local_1160 << (local_1141 & 0x1f);
        uVar10 = local_1174 & uVar4 | local_1164 << (local_1141 & 0x1f);
        local_1168 = uVar7 >> 1 ^ local_1154[uVar7 & 1];
        local_116c = uVar8 >> 1 ^ local_1154[uVar8 & 1];
        local_1170 = uVar9 >> 1 ^ local_1154[uVar9 & 1];
        local_1174 = uVar10 >> 1 ^ local_1154[uVar10 & 1];
        local_2c = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_2c = in_stack_00000010[0x1f] * in_stack_00000018[-0x20];
        case 0x1f:
          local_2c = in_stack_00000010[0x1e] * in_stack_00000018[-0x1f] + local_2c;
        case 0x1e:
          local_2c = in_stack_00000010[0x1d] * in_stack_00000018[-0x1e] + local_2c;
        case 0x1d:
          local_2c = in_stack_00000010[0x1c] * in_stack_00000018[-0x1d] + local_2c;
        case 0x1c:
          local_2c = in_stack_00000010[0x1b] * in_stack_00000018[-0x1c] + local_2c;
        case 0x1b:
          local_2c = in_stack_00000010[0x1a] * in_stack_00000018[-0x1b] + local_2c;
        case 0x1a:
          local_2c = in_stack_00000010[0x19] * in_stack_00000018[-0x1a] + local_2c;
        case 0x19:
          local_2c = in_stack_00000010[0x18] * in_stack_00000018[-0x19] + local_2c;
        case 0x18:
          local_2c = in_stack_00000010[0x17] * in_stack_00000018[-0x18] + local_2c;
        case 0x17:
          local_2c = in_stack_00000010[0x16] * in_stack_00000018[-0x17] + local_2c;
        case 0x16:
          local_2c = in_stack_00000010[0x15] * in_stack_00000018[-0x16] + local_2c;
        case 0x15:
          local_2c = in_stack_00000010[0x14] * in_stack_00000018[-0x15] + local_2c;
        case 0x14:
          local_2c = in_stack_00000010[0x13] * in_stack_00000018[-0x14] + local_2c;
        case 0x13:
          local_2c = in_stack_00000010[0x12] * in_stack_00000018[-0x13] + local_2c;
        case 0x12:
          local_2c = in_stack_00000010[0x11] * in_stack_00000018[-0x12] + local_2c;
        case 0x11:
          local_2c = in_stack_00000010[0x10] * in_stack_00000018[-0x11] + local_2c;
        case 0x10:
          local_2c = in_stack_00000010[0xf] * in_stack_00000018[-0x10] + local_2c;
        case 0xf:
          local_2c = in_stack_00000010[0xe] * in_stack_00000018[-0xf] + local_2c;
        case 0xe:
          local_2c = in_stack_00000010[0xd] * in_stack_00000018[-0xe] + local_2c;
        case 0xd:
          local_2c = in_stack_00000010[0xc] * in_stack_00000018[-0xd] + local_2c;
        case 0xc:
          local_2c = in_stack_00000010[0xb] * in_stack_00000018[-0xc] + local_2c;
        case 0xb:
          local_2c = in_stack_00000010[10] * in_stack_00000018[-0xb] + local_2c;
        case 10:
          local_2c = in_stack_00000010[9] * in_stack_00000018[-10] + local_2c;
        case 9:
          local_2c = in_stack_00000010[8] * in_stack_00000018[-9] + local_2c;
        case 8:
          local_2c = in_stack_00000010[7] * in_stack_00000018[-8] + local_2c;
        case 7:
          local_2c = in_stack_00000010[6] * in_stack_00000018[-7] + local_2c;
        case 6:
          local_2c = in_stack_00000010[5] * in_stack_00000018[-6] + local_2c;
        case 5:
          local_2c = in_stack_00000010[4] * in_stack_00000018[-5] + local_2c;
        case 4:
          local_2c = in_stack_00000010[3] * in_stack_00000018[-4] + local_2c;
        case 3:
          local_2c = in_stack_00000010[2] * in_stack_00000018[-3] + local_2c;
        case 2:
          local_2c = in_stack_00000010[1] * in_stack_00000018[-2] + local_2c;
        case 1:
          local_2c = *in_stack_00000010 * in_stack_00000018[-1] + local_2c;
        }
        local_18 = (byte)local_1154[2];
        *in_stack_00000018 = local_1168 + (local_2c >> (local_18 & 0x1f));
        local_4c = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_4c = in_stack_00000010[0x1f] * in_stack_00000018[-0x1f];
        case 0x1f:
          local_4c = in_stack_00000010[0x1e] * in_stack_00000018[-0x1e] + local_4c;
        case 0x1e:
          local_4c = in_stack_00000010[0x1d] * in_stack_00000018[-0x1d] + local_4c;
        case 0x1d:
          local_4c = in_stack_00000010[0x1c] * in_stack_00000018[-0x1c] + local_4c;
        case 0x1c:
          local_4c = in_stack_00000010[0x1b] * in_stack_00000018[-0x1b] + local_4c;
        case 0x1b:
          local_4c = in_stack_00000010[0x1a] * in_stack_00000018[-0x1a] + local_4c;
        case 0x1a:
          local_4c = in_stack_00000010[0x19] * in_stack_00000018[-0x19] + local_4c;
        case 0x19:
          local_4c = in_stack_00000010[0x18] * in_stack_00000018[-0x18] + local_4c;
        case 0x18:
          local_4c = in_stack_00000010[0x17] * in_stack_00000018[-0x17] + local_4c;
        case 0x17:
          local_4c = in_stack_00000010[0x16] * in_stack_00000018[-0x16] + local_4c;
        case 0x16:
          local_4c = in_stack_00000010[0x15] * in_stack_00000018[-0x15] + local_4c;
        case 0x15:
          local_4c = in_stack_00000010[0x14] * in_stack_00000018[-0x14] + local_4c;
        case 0x14:
          local_4c = in_stack_00000010[0x13] * in_stack_00000018[-0x13] + local_4c;
        case 0x13:
          local_4c = in_stack_00000010[0x12] * in_stack_00000018[-0x12] + local_4c;
        case 0x12:
          local_4c = in_stack_00000010[0x11] * in_stack_00000018[-0x11] + local_4c;
        case 0x11:
          local_4c = in_stack_00000010[0x10] * in_stack_00000018[-0x10] + local_4c;
        case 0x10:
          local_4c = in_stack_00000010[0xf] * in_stack_00000018[-0xf] + local_4c;
        case 0xf:
          local_4c = in_stack_00000010[0xe] * in_stack_00000018[-0xe] + local_4c;
        case 0xe:
          local_4c = in_stack_00000010[0xd] * in_stack_00000018[-0xd] + local_4c;
        case 0xd:
          local_4c = in_stack_00000010[0xc] * in_stack_00000018[-0xc] + local_4c;
        case 0xc:
          local_4c = in_stack_00000010[0xb] * in_stack_00000018[-0xb] + local_4c;
        case 0xb:
          local_4c = in_stack_00000010[10] * in_stack_00000018[-10] + local_4c;
        case 10:
          local_4c = in_stack_00000010[9] * in_stack_00000018[-9] + local_4c;
        case 9:
          local_4c = in_stack_00000010[8] * in_stack_00000018[-8] + local_4c;
        case 8:
          local_4c = in_stack_00000010[7] * in_stack_00000018[-7] + local_4c;
        case 7:
          local_4c = in_stack_00000010[6] * in_stack_00000018[-6] + local_4c;
        case 6:
          local_4c = in_stack_00000010[5] * in_stack_00000018[-5] + local_4c;
        case 5:
          local_4c = in_stack_00000010[4] * in_stack_00000018[-4] + local_4c;
        case 4:
          local_4c = in_stack_00000010[3] * in_stack_00000018[-3] + local_4c;
        case 3:
          local_4c = in_stack_00000010[2] * in_stack_00000018[-2] + local_4c;
        case 2:
          local_4c = in_stack_00000010[1] * in_stack_00000018[-1] + local_4c;
        case 1:
          local_4c = *in_stack_00000010 * *in_stack_00000018 + local_4c;
        }
        in_stack_00000018[1] = local_116c + (local_4c >> (local_18 & 0x1f));
        local_6c = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_6c = in_stack_00000010[0x1f] * in_stack_00000018[-0x1e];
        case 0x1f:
          local_6c = in_stack_00000010[0x1e] * in_stack_00000018[-0x1d] + local_6c;
        case 0x1e:
          local_6c = in_stack_00000010[0x1d] * in_stack_00000018[-0x1c] + local_6c;
        case 0x1d:
          local_6c = in_stack_00000010[0x1c] * in_stack_00000018[-0x1b] + local_6c;
        case 0x1c:
          local_6c = in_stack_00000010[0x1b] * in_stack_00000018[-0x1a] + local_6c;
        case 0x1b:
          local_6c = in_stack_00000010[0x1a] * in_stack_00000018[-0x19] + local_6c;
        case 0x1a:
          local_6c = in_stack_00000010[0x19] * in_stack_00000018[-0x18] + local_6c;
        case 0x19:
          local_6c = in_stack_00000010[0x18] * in_stack_00000018[-0x17] + local_6c;
        case 0x18:
          local_6c = in_stack_00000010[0x17] * in_stack_00000018[-0x16] + local_6c;
        case 0x17:
          local_6c = in_stack_00000010[0x16] * in_stack_00000018[-0x15] + local_6c;
        case 0x16:
          local_6c = in_stack_00000010[0x15] * in_stack_00000018[-0x14] + local_6c;
        case 0x15:
          local_6c = in_stack_00000010[0x14] * in_stack_00000018[-0x13] + local_6c;
        case 0x14:
          local_6c = in_stack_00000010[0x13] * in_stack_00000018[-0x12] + local_6c;
        case 0x13:
          local_6c = in_stack_00000010[0x12] * in_stack_00000018[-0x11] + local_6c;
        case 0x12:
          local_6c = in_stack_00000010[0x11] * in_stack_00000018[-0x10] + local_6c;
        case 0x11:
          local_6c = in_stack_00000010[0x10] * in_stack_00000018[-0xf] + local_6c;
        case 0x10:
          local_6c = in_stack_00000010[0xf] * in_stack_00000018[-0xe] + local_6c;
        case 0xf:
          local_6c = in_stack_00000010[0xe] * in_stack_00000018[-0xd] + local_6c;
        case 0xe:
          local_6c = in_stack_00000010[0xd] * in_stack_00000018[-0xc] + local_6c;
        case 0xd:
          local_6c = in_stack_00000010[0xc] * in_stack_00000018[-0xb] + local_6c;
        case 0xc:
          local_6c = in_stack_00000010[0xb] * in_stack_00000018[-10] + local_6c;
        case 0xb:
          local_6c = in_stack_00000010[10] * in_stack_00000018[-9] + local_6c;
        case 10:
          local_6c = in_stack_00000010[9] * in_stack_00000018[-8] + local_6c;
        case 9:
          local_6c = in_stack_00000010[8] * in_stack_00000018[-7] + local_6c;
        case 8:
          local_6c = in_stack_00000010[7] * in_stack_00000018[-6] + local_6c;
        case 7:
          local_6c = in_stack_00000010[6] * in_stack_00000018[-5] + local_6c;
        case 6:
          local_6c = in_stack_00000010[5] * in_stack_00000018[-4] + local_6c;
        case 5:
          local_6c = in_stack_00000010[4] * in_stack_00000018[-3] + local_6c;
        case 4:
          local_6c = in_stack_00000010[3] * in_stack_00000018[-2] + local_6c;
        case 3:
          local_6c = in_stack_00000010[2] * in_stack_00000018[-1] + local_6c;
        case 2:
          local_6c = in_stack_00000010[1] * *in_stack_00000018 + local_6c;
        case 1:
          local_6c = *in_stack_00000010 * in_stack_00000018[1] + local_6c;
        }
        in_stack_00000018[2] = local_1170 + (local_6c >> (local_18 & 0x1f));
        local_8c = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_8c = in_stack_00000010[0x1f] * in_stack_00000018[-0x1d];
        case 0x1f:
          local_8c = in_stack_00000010[0x1e] * in_stack_00000018[-0x1c] + local_8c;
        case 0x1e:
          local_8c = in_stack_00000010[0x1d] * in_stack_00000018[-0x1b] + local_8c;
        case 0x1d:
          local_8c = in_stack_00000010[0x1c] * in_stack_00000018[-0x1a] + local_8c;
        case 0x1c:
          local_8c = in_stack_00000010[0x1b] * in_stack_00000018[-0x19] + local_8c;
        case 0x1b:
          local_8c = in_stack_00000010[0x1a] * in_stack_00000018[-0x18] + local_8c;
        case 0x1a:
          local_8c = in_stack_00000010[0x19] * in_stack_00000018[-0x17] + local_8c;
        case 0x19:
          local_8c = in_stack_00000010[0x18] * in_stack_00000018[-0x16] + local_8c;
        case 0x18:
          local_8c = in_stack_00000010[0x17] * in_stack_00000018[-0x15] + local_8c;
        case 0x17:
          local_8c = in_stack_00000010[0x16] * in_stack_00000018[-0x14] + local_8c;
        case 0x16:
          local_8c = in_stack_00000010[0x15] * in_stack_00000018[-0x13] + local_8c;
        case 0x15:
          local_8c = in_stack_00000010[0x14] * in_stack_00000018[-0x12] + local_8c;
        case 0x14:
          local_8c = in_stack_00000010[0x13] * in_stack_00000018[-0x11] + local_8c;
        case 0x13:
          local_8c = in_stack_00000010[0x12] * in_stack_00000018[-0x10] + local_8c;
        case 0x12:
          local_8c = in_stack_00000010[0x11] * in_stack_00000018[-0xf] + local_8c;
        case 0x11:
          local_8c = in_stack_00000010[0x10] * in_stack_00000018[-0xe] + local_8c;
        case 0x10:
          local_8c = in_stack_00000010[0xf] * in_stack_00000018[-0xd] + local_8c;
        case 0xf:
          local_8c = in_stack_00000010[0xe] * in_stack_00000018[-0xc] + local_8c;
        case 0xe:
          local_8c = in_stack_00000010[0xd] * in_stack_00000018[-0xb] + local_8c;
        case 0xd:
          local_8c = in_stack_00000010[0xc] * in_stack_00000018[-10] + local_8c;
        case 0xc:
          local_8c = in_stack_00000010[0xb] * in_stack_00000018[-9] + local_8c;
        case 0xb:
          local_8c = in_stack_00000010[10] * in_stack_00000018[-8] + local_8c;
        case 10:
          local_8c = in_stack_00000010[9] * in_stack_00000018[-7] + local_8c;
        case 9:
          local_8c = in_stack_00000010[8] * in_stack_00000018[-6] + local_8c;
        case 8:
          local_8c = in_stack_00000010[7] * in_stack_00000018[-5] + local_8c;
        case 7:
          local_8c = in_stack_00000010[6] * in_stack_00000018[-4] + local_8c;
        case 6:
          local_8c = in_stack_00000010[5] * in_stack_00000018[-3] + local_8c;
        case 5:
          local_8c = in_stack_00000010[4] * in_stack_00000018[-2] + local_8c;
        case 4:
          local_8c = in_stack_00000010[3] * in_stack_00000018[-1] + local_8c;
        case 3:
          local_8c = in_stack_00000010[2] * *in_stack_00000018 + local_8c;
        case 2:
          local_8c = in_stack_00000010[1] * in_stack_00000018[1] + local_8c;
        case 1:
          local_8c = *in_stack_00000010 * in_stack_00000018[2] + local_8c;
        default:
          in_stack_00000018[3] = local_1174 + (local_8c >> (local_18 & 0x1f));
          in_stack_00000018 = in_stack_00000018 + 4;
        }
      }
    }
    else {
      while (lVar3 = local_1138, in_stack_00000018 < piVar11) {
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_2f8 = *(ulong *)(local_1138 + 0x1030);
        local_2fc = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_2f8 == 0) {
            local_168 = 0x40;
          }
          else {
            local_174 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_2f8 >> 0x3c) * 4);
            if (local_174 == 0) {
              local_174 = 0;
              local_170 = local_2f8;
              if ((local_2f8 & 0xffffffff00000000) == 0) {
                local_174 = 0x20;
                local_170 = local_2f8 << 0x20;
              }
              if ((local_170 & 0xffff000000000000) == 0) {
                local_174 = local_174 + 0x10;
                local_170 = local_170 << 0x10;
              }
              if ((local_170 & 0xff00000000000000) == 0) {
                local_174 = local_174 + 8;
                local_170 = local_170 << 8;
              }
              if ((local_170 & 0xf000000000000000) == 0) {
                local_174 = local_174 + 4;
                local_170 = local_170 << 4;
              }
              local_174 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_170 >> 0x3c) * 4) + local_174;
            }
            local_168 = local_174 - 1;
          }
          local_26c = local_168;
        }
        else {
          local_26c = (uint)LZCOUNT(local_2f8);
        }
        local_300 = local_26c;
        if (local_26c < 0x40) {
          local_1158 = local_26c;
          local_310 = local_1158;
        }
        else {
          local_310 = 0x40 - local_2fc;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_21a = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_21a = local_21a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_21a >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_21a;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_2f8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_2fc = 0;
              *(ulong *)(lVar3 + 0x1040) = local_2f8;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_0027b584;
              }
              local_2f8 = *(ulong *)(lVar3 + 0x1030);
              local_2fc = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_160 = local_2f8;
              if (local_2f8 == 0) {
                local_154 = 0x40;
              }
              else {
                local_164 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_2f8 >> 0x3c) * 4);
                if (local_164 == 0) {
                  local_164 = 0;
                  if ((local_2f8 & 0xffffffff00000000) == 0) {
                    local_164 = 0x20;
                    local_160 = local_2f8 << 0x20;
                  }
                  if ((local_160 & 0xffff000000000000) == 0) {
                    local_164 = local_164 + 0x10;
                    local_160 = local_160 << 0x10;
                  }
                  if ((local_160 & 0xff00000000000000) == 0) {
                    local_164 = local_164 + 8;
                    local_160 = local_160 << 8;
                  }
                  if ((local_160 & 0xf000000000000000) == 0) {
                    local_164 = local_164 + 4;
                    local_160 = local_160 << 4;
                  }
                  local_164 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_160 >> 0x3c) * 4) + local_164;
                }
                local_154 = local_164 - 1;
              }
              local_27c = local_154;
            }
            else {
              local_27c = (uint)LZCOUNT(local_2f8);
            }
            local_300 = local_27c;
            local_310 = local_27c + local_310;
          } while (0x3f < local_27c);
        }
        local_1158 = local_310;
        uVar12 = local_2f8 << ((byte)local_300 & 0x3f);
        local_300 = local_300 + local_2fc;
        if (0x40U - iVar5 < local_300) {
          local_300 = local_300 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_22e = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_22e = local_22e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_22e >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_22e;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_2f8 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_2f8;
            local_2fc = local_300;
LAB_0027aaa3:
            local_1168 = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_2f8 >> (0x40 - (byte)local_300 & 0x3f));
            local_2f8 = local_2f8 << ((byte)local_300 & 0x3f);
            goto LAB_0027aafa;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_300 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_2f8 = *(ulong *)(lVar3 + 0x1030);
              local_2fc = *(int *)(lVar3 + 0x2c) + local_300;
              goto LAB_0027aaa3;
            }
            bVar14 = false;
          }
        }
        else {
          local_1168 = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_2f8 = uVar12 << ((byte)iVar5 & 0x3f);
          local_2fc = iVar5 + local_300;
LAB_0027aafa:
          *(ulong *)(lVar3 + 0x1030) = local_2f8;
          *(uint *)(lVar3 + 0x2c) = local_2fc;
          bVar14 = true;
        }
LAB_0027b584:
        lVar3 = local_1138;
        if (!bVar14) {
          return 0;
        }
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_4b8 = *(ulong *)(local_1138 + 0x1030);
        local_4bc = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_4b8 == 0) {
            local_328 = 0x40;
          }
          else {
            local_334 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_4b8 >> 0x3c) * 4);
            if (local_334 == 0) {
              local_334 = 0;
              local_330 = local_4b8;
              if ((local_4b8 & 0xffffffff00000000) == 0) {
                local_334 = 0x20;
                local_330 = local_4b8 << 0x20;
              }
              if ((local_330 & 0xffff000000000000) == 0) {
                local_334 = local_334 + 0x10;
                local_330 = local_330 << 0x10;
              }
              if ((local_330 & 0xff00000000000000) == 0) {
                local_334 = local_334 + 8;
                local_330 = local_330 << 8;
              }
              if ((local_330 & 0xf000000000000000) == 0) {
                local_334 = local_334 + 4;
                local_330 = local_330 << 4;
              }
              local_334 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_330 >> 0x3c) * 4) + local_334;
            }
            local_328 = local_334 - 1;
          }
          local_42c = local_328;
        }
        else {
          local_42c = (uint)LZCOUNT(local_4b8);
        }
        local_4c0 = local_42c;
        if (local_42c < 0x40) {
          local_115c = local_42c;
          local_4d0 = local_115c;
        }
        else {
          local_4d0 = 0x40 - local_4bc;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_3da = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_3da = local_3da << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_3da >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_3da;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_4b8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_4bc = 0;
              *(ulong *)(lVar3 + 0x1040) = local_4b8;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_0027cc3b;
              }
              local_4b8 = *(ulong *)(lVar3 + 0x1030);
              local_4bc = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_320 = local_4b8;
              if (local_4b8 == 0) {
                local_314 = 0x40;
              }
              else {
                local_324 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_4b8 >> 0x3c) * 4);
                if (local_324 == 0) {
                  local_324 = 0;
                  if ((local_4b8 & 0xffffffff00000000) == 0) {
                    local_324 = 0x20;
                    local_320 = local_4b8 << 0x20;
                  }
                  if ((local_320 & 0xffff000000000000) == 0) {
                    local_324 = local_324 + 0x10;
                    local_320 = local_320 << 0x10;
                  }
                  if ((local_320 & 0xff00000000000000) == 0) {
                    local_324 = local_324 + 8;
                    local_320 = local_320 << 8;
                  }
                  if ((local_320 & 0xf000000000000000) == 0) {
                    local_324 = local_324 + 4;
                    local_320 = local_320 << 4;
                  }
                  local_324 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_320 >> 0x3c) * 4) + local_324;
                }
                local_314 = local_324 - 1;
              }
              local_43c = local_314;
            }
            else {
              local_43c = (uint)LZCOUNT(local_4b8);
            }
            local_4c0 = local_43c;
            local_4d0 = local_43c + local_4d0;
          } while (0x3f < local_43c);
        }
        local_115c = local_4d0;
        uVar12 = local_4b8 << ((byte)local_4c0 & 0x3f);
        local_4c0 = local_4c0 + local_4bc;
        if (0x40U - iVar5 < local_4c0) {
          local_4c0 = local_4c0 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_3ee = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_3ee = local_3ee << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_3ee >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_3ee;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_4b8 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_4b8;
            local_4bc = local_4c0;
LAB_0027c15a:
            local_116c = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_4b8 >> (0x40 - (byte)local_4c0 & 0x3f));
            local_4b8 = local_4b8 << ((byte)local_4c0 & 0x3f);
            goto LAB_0027c1b1;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_4c0 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_4b8 = *(ulong *)(lVar3 + 0x1030);
              local_4bc = *(int *)(lVar3 + 0x2c) + local_4c0;
              goto LAB_0027c15a;
            }
            bVar14 = false;
          }
        }
        else {
          local_116c = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_4b8 = uVar12 << ((byte)iVar5 & 0x3f);
          local_4bc = iVar5 + local_4c0;
LAB_0027c1b1:
          *(ulong *)(lVar3 + 0x1030) = local_4b8;
          *(uint *)(lVar3 + 0x2c) = local_4bc;
          bVar14 = true;
        }
LAB_0027cc3b:
        lVar3 = local_1138;
        if (!bVar14) {
          return 0;
        }
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_678 = *(ulong *)(local_1138 + 0x1030);
        local_67c = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_678 == 0) {
            local_4e8 = 0x40;
          }
          else {
            local_4f4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_678 >> 0x3c) * 4);
            if (local_4f4 == 0) {
              local_4f4 = 0;
              local_4f0 = local_678;
              if ((local_678 & 0xffffffff00000000) == 0) {
                local_4f4 = 0x20;
                local_4f0 = local_678 << 0x20;
              }
              if ((local_4f0 & 0xffff000000000000) == 0) {
                local_4f4 = local_4f4 + 0x10;
                local_4f0 = local_4f0 << 0x10;
              }
              if ((local_4f0 & 0xff00000000000000) == 0) {
                local_4f4 = local_4f4 + 8;
                local_4f0 = local_4f0 << 8;
              }
              if ((local_4f0 & 0xf000000000000000) == 0) {
                local_4f4 = local_4f4 + 4;
                local_4f0 = local_4f0 << 4;
              }
              local_4f4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_4f0 >> 0x3c) * 4) + local_4f4;
            }
            local_4e8 = local_4f4 - 1;
          }
          local_5ec = local_4e8;
        }
        else {
          local_5ec = (uint)LZCOUNT(local_678);
        }
        local_680 = local_5ec;
        if (local_5ec < 0x40) {
          local_1160 = local_5ec;
          local_690 = local_1160;
        }
        else {
          local_690 = 0x40 - local_67c;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_59a = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_59a = local_59a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_59a >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_59a;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_678 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_67c = 0;
              *(ulong *)(lVar3 + 0x1040) = local_678;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_0027e2f2;
              }
              local_678 = *(ulong *)(lVar3 + 0x1030);
              local_67c = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_4e0 = local_678;
              if (local_678 == 0) {
                local_4d4 = 0x40;
              }
              else {
                local_4e4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_678 >> 0x3c) * 4);
                if (local_4e4 == 0) {
                  local_4e4 = 0;
                  if ((local_678 & 0xffffffff00000000) == 0) {
                    local_4e4 = 0x20;
                    local_4e0 = local_678 << 0x20;
                  }
                  if ((local_4e0 & 0xffff000000000000) == 0) {
                    local_4e4 = local_4e4 + 0x10;
                    local_4e0 = local_4e0 << 0x10;
                  }
                  if ((local_4e0 & 0xff00000000000000) == 0) {
                    local_4e4 = local_4e4 + 8;
                    local_4e0 = local_4e0 << 8;
                  }
                  if ((local_4e0 & 0xf000000000000000) == 0) {
                    local_4e4 = local_4e4 + 4;
                    local_4e0 = local_4e0 << 4;
                  }
                  local_4e4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_4e0 >> 0x3c) * 4) + local_4e4;
                }
                local_4d4 = local_4e4 - 1;
              }
              local_5fc = local_4d4;
            }
            else {
              local_5fc = (uint)LZCOUNT(local_678);
            }
            local_680 = local_5fc;
            local_690 = local_5fc + local_690;
          } while (0x3f < local_5fc);
        }
        local_1160 = local_690;
        uVar12 = local_678 << ((byte)local_680 & 0x3f);
        local_680 = local_680 + local_67c;
        if (0x40U - iVar5 < local_680) {
          local_680 = local_680 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_5ae = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_5ae = local_5ae << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_5ae >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_5ae;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_678 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_678;
            local_67c = local_680;
LAB_0027d811:
            local_1170 = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_678 >> (0x40 - (byte)local_680 & 0x3f));
            local_678 = local_678 << ((byte)local_680 & 0x3f);
            goto LAB_0027d868;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_680 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_678 = *(ulong *)(lVar3 + 0x1030);
              local_67c = *(int *)(lVar3 + 0x2c) + local_680;
              goto LAB_0027d811;
            }
            bVar14 = false;
          }
        }
        else {
          local_1170 = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_678 = uVar12 << ((byte)iVar5 & 0x3f);
          local_67c = iVar5 + local_680;
LAB_0027d868:
          *(ulong *)(lVar3 + 0x1030) = local_678;
          *(uint *)(lVar3 + 0x2c) = local_67c;
          bVar14 = true;
        }
LAB_0027e2f2:
        lVar3 = local_1138;
        if (!bVar14) {
          return 0;
        }
        iVar5 = local_1141 + 1;
        bVar13 = 0x40 - (byte)iVar5;
        local_838 = *(ulong *)(local_1138 + 0x1030);
        local_83c = *(int *)(local_1138 + 0x2c);
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (local_838 == 0) {
            local_6a8 = 0x40;
          }
          else {
            local_6b4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_838 >> 0x3c) * 4);
            if (local_6b4 == 0) {
              local_6b4 = 0;
              local_6b0 = local_838;
              if ((local_838 & 0xffffffff00000000) == 0) {
                local_6b4 = 0x20;
                local_6b0 = local_838 << 0x20;
              }
              if ((local_6b0 & 0xffff000000000000) == 0) {
                local_6b4 = local_6b4 + 0x10;
                local_6b0 = local_6b0 << 0x10;
              }
              if ((local_6b0 & 0xff00000000000000) == 0) {
                local_6b4 = local_6b4 + 8;
                local_6b0 = local_6b0 << 8;
              }
              if ((local_6b0 & 0xf000000000000000) == 0) {
                local_6b4 = local_6b4 + 4;
                local_6b0 = local_6b0 << 4;
              }
              local_6b4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_6b0 >> 0x3c) * 4) + local_6b4;
            }
            local_6a8 = local_6b4 - 1;
          }
          local_7ac = local_6a8;
        }
        else {
          local_7ac = (uint)LZCOUNT(local_838);
        }
        local_840 = local_7ac;
        if (local_7ac < 0x40) {
          local_1164 = local_7ac;
          local_850 = local_1164;
        }
        else {
          local_850 = 0x40 - local_83c;
          do {
            if (*(uint *)(lVar3 + 0x28) < 0x200) {
              if (*(int *)(lVar3 + 0x1048) == 0) {
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                *(ma_uint16 *)(lVar3 + 0x1038) =
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >>
                                                           8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                    << 8 ^ ma_dr_flac__crc16_table
                                                           [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                       (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(*(ushort *)
                                                                               (lVar3 + 0x1038) << 8
                                                                             ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                           (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                     ma_dr_flac__crc16_table
                     [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                           [(int)((int)(uint)(ushort
                                                  )(ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                               ma_dr_flac__crc16_table
                                               [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                          [(int)((int)(uint)(ushort)
                                                  (ma_dr_flac__crc16_table
                                                   [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                           (uint)(byte)uVar1)];
              }
              else {
                local_75a = *(ushort *)(lVar3 + 0x1038);
                uVar1 = *(undefined8 *)(lVar3 + 0x1040);
                switch(-*(int *)(lVar3 + 0x1048)) {
                case 0:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                              ];
                case -1:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                              ];
                case -2:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                              ];
                case -3:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                              ];
                case -4:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                              ];
                case -5:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                              ];
                case -6:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
                case -7:
                  local_75a = local_75a << 8 ^
                              ma_dr_flac__crc16_table
                              [(int)((int)(uint)local_75a >> 8 ^ (uint)(byte)uVar1)];
                default:
                  *(ushort *)(lVar3 + 0x1038) = local_75a;
                  *(undefined4 *)(lVar3 + 0x1048) = 0;
                }
              }
              uVar7 = *(uint *)(lVar3 + 0x28);
              *(uint *)(lVar3 + 0x28) = uVar7 + 1;
              uVar12 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
              local_838 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_83c = 0;
              *(ulong *)(lVar3 + 0x1040) = local_838;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
              if (mVar6 == 0) {
                bVar14 = false;
                goto LAB_0027f9a9;
              }
              local_838 = *(ulong *)(lVar3 + 0x1030);
              local_83c = *(int *)(lVar3 + 0x2c);
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              local_6a0 = local_838;
              if (local_838 == 0) {
                local_694 = 0x40;
              }
              else {
                local_6a4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_838 >> 0x3c) * 4);
                if (local_6a4 == 0) {
                  local_6a4 = 0;
                  if ((local_838 & 0xffffffff00000000) == 0) {
                    local_6a4 = 0x20;
                    local_6a0 = local_838 << 0x20;
                  }
                  if ((local_6a0 & 0xffff000000000000) == 0) {
                    local_6a4 = local_6a4 + 0x10;
                    local_6a0 = local_6a0 << 0x10;
                  }
                  if ((local_6a0 & 0xff00000000000000) == 0) {
                    local_6a4 = local_6a4 + 8;
                    local_6a0 = local_6a0 << 8;
                  }
                  if ((local_6a0 & 0xf000000000000000) == 0) {
                    local_6a4 = local_6a4 + 4;
                    local_6a0 = local_6a0 << 4;
                  }
                  local_6a4 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (local_6a0 >> 0x3c) * 4) + local_6a4;
                }
                local_694 = local_6a4 - 1;
              }
              local_7bc = local_694;
            }
            else {
              local_7bc = (uint)LZCOUNT(local_838);
            }
            local_840 = local_7bc;
            local_850 = local_7bc + local_850;
          } while (0x3f < local_7bc);
        }
        local_1164 = local_850;
        uVar12 = local_838 << ((byte)local_840 & 0x3f);
        local_840 = local_840 + local_83c;
        if (0x40U - iVar5 < local_840) {
          local_840 = local_840 - (0x40U - iVar5);
          if (*(uint *)(lVar3 + 0x28) < 0x200) {
            if (*(int *)(lVar3 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              *(ma_uint16 *)(lVar3 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (lVar3 + 0x1038) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (lVar3 + 
                                                  0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (lVar3 + 0x1038) >> 8 ^
                                                                (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  lVar3 + 0x1038) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(lVar3 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (lVar3 + 0x1038) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(lVar3 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (lVar3 + 0x1038) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(lVar3 + 0x1038) >> 8
                                                        ^ (uint)(byte)((ulong)uVar1 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_76e = *(ushort *)(lVar3 + 0x1038);
              uVar1 = *(undefined8 *)(lVar3 + 0x1040);
              switch(-*(int *)(lVar3 + 0x1048)) {
              case 0:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
              case -1:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
              case -2:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
              case -3:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
              case -4:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
              case -5:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
              case -6:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_76e = local_76e << 8 ^
                            ma_dr_flac__crc16_table
                            [(int)((int)(uint)local_76e >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(lVar3 + 0x1038) = local_76e;
                *(undefined4 *)(lVar3 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(lVar3 + 0x28);
            *(uint *)(lVar3 + 0x28) = uVar7 + 1;
            uVar2 = *(ulong *)(lVar3 + 0x30 + (ulong)uVar7 * 8);
            local_838 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *(ulong *)(lVar3 + 0x1040) = local_838;
            local_83c = local_840;
LAB_0027eec8:
            local_1174 = (uint)(uVar12 >> (bVar13 & 0x3f)) |
                         (uint)(local_838 >> (0x40 - (byte)local_840 & 0x3f));
            local_838 = local_838 << ((byte)local_840 & 0x3f);
            goto LAB_0027ef1f;
          }
          mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
          if (mVar6 == 0) {
            bVar14 = false;
          }
          else {
            if ((ulong)local_840 <= 0x40 - (ulong)*(uint *)(lVar3 + 0x2c)) {
              local_838 = *(ulong *)(lVar3 + 0x1030);
              local_83c = *(int *)(lVar3 + 0x2c) + local_840;
              goto LAB_0027eec8;
            }
            bVar14 = false;
          }
        }
        else {
          local_1174 = (uint)(uVar12 >> (bVar13 & 0x3f));
          local_838 = uVar12 << ((byte)iVar5 & 0x3f);
          local_83c = iVar5 + local_840;
LAB_0027ef1f:
          *(ulong *)(lVar3 + 0x1030) = local_838;
          *(uint *)(lVar3 + 0x2c) = local_83c;
          bVar14 = true;
        }
LAB_0027f9a9:
        if (!bVar14) {
          return 0;
        }
        uVar7 = local_1168 & uVar4 | local_1158 << (local_1141 & 0x1f);
        uVar8 = local_116c & uVar4 | local_115c << (local_1141 & 0x1f);
        uVar9 = local_1170 & uVar4 | local_1160 << (local_1141 & 0x1f);
        uVar10 = local_1174 & uVar4 | local_1164 << (local_1141 & 0x1f);
        local_1168 = uVar7 >> 1 ^ local_1154[uVar7 & 1];
        local_116c = uVar8 >> 1 ^ local_1154[uVar8 & 1];
        local_1170 = uVar9 >> 1 ^ local_1154[uVar9 & 1];
        local_1174 = uVar10 >> 1 ^ local_1154[uVar10 & 1];
        local_d0 = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_d0 = (long)in_stack_00000010[0x1f] * (long)in_stack_00000018[-0x20];
        case 0x1f:
          local_d0 = (long)in_stack_00000010[0x1e] * (long)in_stack_00000018[-0x1f] + local_d0;
        case 0x1e:
          local_d0 = (long)in_stack_00000010[0x1d] * (long)in_stack_00000018[-0x1e] + local_d0;
        case 0x1d:
          local_d0 = (long)in_stack_00000010[0x1c] * (long)in_stack_00000018[-0x1d] + local_d0;
        case 0x1c:
          local_d0 = (long)in_stack_00000010[0x1b] * (long)in_stack_00000018[-0x1c] + local_d0;
        case 0x1b:
          local_d0 = (long)in_stack_00000010[0x1a] * (long)in_stack_00000018[-0x1b] + local_d0;
        case 0x1a:
          local_d0 = (long)in_stack_00000010[0x19] * (long)in_stack_00000018[-0x1a] + local_d0;
        case 0x19:
          local_d0 = (long)in_stack_00000010[0x18] * (long)in_stack_00000018[-0x19] + local_d0;
        case 0x18:
          local_d0 = (long)in_stack_00000010[0x17] * (long)in_stack_00000018[-0x18] + local_d0;
        case 0x17:
          local_d0 = (long)in_stack_00000010[0x16] * (long)in_stack_00000018[-0x17] + local_d0;
        case 0x16:
          local_d0 = (long)in_stack_00000010[0x15] * (long)in_stack_00000018[-0x16] + local_d0;
        case 0x15:
          local_d0 = (long)in_stack_00000010[0x14] * (long)in_stack_00000018[-0x15] + local_d0;
        case 0x14:
          local_d0 = (long)in_stack_00000010[0x13] * (long)in_stack_00000018[-0x14] + local_d0;
        case 0x13:
          local_d0 = (long)in_stack_00000010[0x12] * (long)in_stack_00000018[-0x13] + local_d0;
        case 0x12:
          local_d0 = (long)in_stack_00000010[0x11] * (long)in_stack_00000018[-0x12] + local_d0;
        case 0x11:
          local_d0 = (long)in_stack_00000010[0x10] * (long)in_stack_00000018[-0x11] + local_d0;
        case 0x10:
          local_d0 = (long)in_stack_00000010[0xf] * (long)in_stack_00000018[-0x10] + local_d0;
        case 0xf:
          local_d0 = (long)in_stack_00000010[0xe] * (long)in_stack_00000018[-0xf] + local_d0;
        case 0xe:
          local_d0 = (long)in_stack_00000010[0xd] * (long)in_stack_00000018[-0xe] + local_d0;
        case 0xd:
          local_d0 = (long)in_stack_00000010[0xc] * (long)in_stack_00000018[-0xd] + local_d0;
        case 0xc:
          local_d0 = (long)in_stack_00000010[0xb] * (long)in_stack_00000018[-0xc] + local_d0;
        case 0xb:
          local_d0 = (long)in_stack_00000010[10] * (long)in_stack_00000018[-0xb] + local_d0;
        case 10:
          local_d0 = (long)in_stack_00000010[9] * (long)in_stack_00000018[-10] + local_d0;
        case 9:
          local_d0 = (long)in_stack_00000010[8] * (long)in_stack_00000018[-9] + local_d0;
        case 8:
          local_d0 = (long)in_stack_00000010[7] * (long)in_stack_00000018[-8] + local_d0;
        case 7:
          local_d0 = (long)in_stack_00000010[6] * (long)in_stack_00000018[-7] + local_d0;
        case 6:
          local_d0 = (long)in_stack_00000010[5] * (long)in_stack_00000018[-6] + local_d0;
        case 5:
          local_d0 = (long)in_stack_00000010[4] * (long)in_stack_00000018[-5] + local_d0;
        case 4:
          local_d0 = (long)in_stack_00000010[3] * (long)in_stack_00000018[-4] + local_d0;
        case 3:
          local_d0 = (long)in_stack_00000010[2] * (long)in_stack_00000018[-3] + local_d0;
        case 2:
          local_d0 = (long)in_stack_00000010[1] * (long)in_stack_00000018[-2] + local_d0;
        case 1:
          local_d0 = (long)*in_stack_00000010 * (long)in_stack_00000018[-1] + local_d0;
        }
        local_b4 = (byte)local_1154[2];
        *in_stack_00000018 = local_1168 + (int)(local_d0 >> (local_b4 & 0x3f));
        local_f0 = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_f0 = (long)in_stack_00000010[0x1f] * (long)in_stack_00000018[-0x1f];
        case 0x1f:
          local_f0 = (long)in_stack_00000010[0x1e] * (long)in_stack_00000018[-0x1e] + local_f0;
        case 0x1e:
          local_f0 = (long)in_stack_00000010[0x1d] * (long)in_stack_00000018[-0x1d] + local_f0;
        case 0x1d:
          local_f0 = (long)in_stack_00000010[0x1c] * (long)in_stack_00000018[-0x1c] + local_f0;
        case 0x1c:
          local_f0 = (long)in_stack_00000010[0x1b] * (long)in_stack_00000018[-0x1b] + local_f0;
        case 0x1b:
          local_f0 = (long)in_stack_00000010[0x1a] * (long)in_stack_00000018[-0x1a] + local_f0;
        case 0x1a:
          local_f0 = (long)in_stack_00000010[0x19] * (long)in_stack_00000018[-0x19] + local_f0;
        case 0x19:
          local_f0 = (long)in_stack_00000010[0x18] * (long)in_stack_00000018[-0x18] + local_f0;
        case 0x18:
          local_f0 = (long)in_stack_00000010[0x17] * (long)in_stack_00000018[-0x17] + local_f0;
        case 0x17:
          local_f0 = (long)in_stack_00000010[0x16] * (long)in_stack_00000018[-0x16] + local_f0;
        case 0x16:
          local_f0 = (long)in_stack_00000010[0x15] * (long)in_stack_00000018[-0x15] + local_f0;
        case 0x15:
          local_f0 = (long)in_stack_00000010[0x14] * (long)in_stack_00000018[-0x14] + local_f0;
        case 0x14:
          local_f0 = (long)in_stack_00000010[0x13] * (long)in_stack_00000018[-0x13] + local_f0;
        case 0x13:
          local_f0 = (long)in_stack_00000010[0x12] * (long)in_stack_00000018[-0x12] + local_f0;
        case 0x12:
          local_f0 = (long)in_stack_00000010[0x11] * (long)in_stack_00000018[-0x11] + local_f0;
        case 0x11:
          local_f0 = (long)in_stack_00000010[0x10] * (long)in_stack_00000018[-0x10] + local_f0;
        case 0x10:
          local_f0 = (long)in_stack_00000010[0xf] * (long)in_stack_00000018[-0xf] + local_f0;
        case 0xf:
          local_f0 = (long)in_stack_00000010[0xe] * (long)in_stack_00000018[-0xe] + local_f0;
        case 0xe:
          local_f0 = (long)in_stack_00000010[0xd] * (long)in_stack_00000018[-0xd] + local_f0;
        case 0xd:
          local_f0 = (long)in_stack_00000010[0xc] * (long)in_stack_00000018[-0xc] + local_f0;
        case 0xc:
          local_f0 = (long)in_stack_00000010[0xb] * (long)in_stack_00000018[-0xb] + local_f0;
        case 0xb:
          local_f0 = (long)in_stack_00000010[10] * (long)in_stack_00000018[-10] + local_f0;
        case 10:
          local_f0 = (long)in_stack_00000010[9] * (long)in_stack_00000018[-9] + local_f0;
        case 9:
          local_f0 = (long)in_stack_00000010[8] * (long)in_stack_00000018[-8] + local_f0;
        case 8:
          local_f0 = (long)in_stack_00000010[7] * (long)in_stack_00000018[-7] + local_f0;
        case 7:
          local_f0 = (long)in_stack_00000010[6] * (long)in_stack_00000018[-6] + local_f0;
        case 6:
          local_f0 = (long)in_stack_00000010[5] * (long)in_stack_00000018[-5] + local_f0;
        case 5:
          local_f0 = (long)in_stack_00000010[4] * (long)in_stack_00000018[-4] + local_f0;
        case 4:
          local_f0 = (long)in_stack_00000010[3] * (long)in_stack_00000018[-3] + local_f0;
        case 3:
          local_f0 = (long)in_stack_00000010[2] * (long)in_stack_00000018[-2] + local_f0;
        case 2:
          local_f0 = (long)in_stack_00000010[1] * (long)in_stack_00000018[-1] + local_f0;
        case 1:
          local_f0 = (long)*in_stack_00000010 * (long)*in_stack_00000018 + local_f0;
        }
        in_stack_00000018[1] = local_116c + (int)(local_f0 >> (local_b4 & 0x3f));
        local_110 = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_110 = (long)in_stack_00000010[0x1f] * (long)in_stack_00000018[-0x1e];
        case 0x1f:
          local_110 = (long)in_stack_00000010[0x1e] * (long)in_stack_00000018[-0x1d] + local_110;
        case 0x1e:
          local_110 = (long)in_stack_00000010[0x1d] * (long)in_stack_00000018[-0x1c] + local_110;
        case 0x1d:
          local_110 = (long)in_stack_00000010[0x1c] * (long)in_stack_00000018[-0x1b] + local_110;
        case 0x1c:
          local_110 = (long)in_stack_00000010[0x1b] * (long)in_stack_00000018[-0x1a] + local_110;
        case 0x1b:
          local_110 = (long)in_stack_00000010[0x1a] * (long)in_stack_00000018[-0x19] + local_110;
        case 0x1a:
          local_110 = (long)in_stack_00000010[0x19] * (long)in_stack_00000018[-0x18] + local_110;
        case 0x19:
          local_110 = (long)in_stack_00000010[0x18] * (long)in_stack_00000018[-0x17] + local_110;
        case 0x18:
          local_110 = (long)in_stack_00000010[0x17] * (long)in_stack_00000018[-0x16] + local_110;
        case 0x17:
          local_110 = (long)in_stack_00000010[0x16] * (long)in_stack_00000018[-0x15] + local_110;
        case 0x16:
          local_110 = (long)in_stack_00000010[0x15] * (long)in_stack_00000018[-0x14] + local_110;
        case 0x15:
          local_110 = (long)in_stack_00000010[0x14] * (long)in_stack_00000018[-0x13] + local_110;
        case 0x14:
          local_110 = (long)in_stack_00000010[0x13] * (long)in_stack_00000018[-0x12] + local_110;
        case 0x13:
          local_110 = (long)in_stack_00000010[0x12] * (long)in_stack_00000018[-0x11] + local_110;
        case 0x12:
          local_110 = (long)in_stack_00000010[0x11] * (long)in_stack_00000018[-0x10] + local_110;
        case 0x11:
          local_110 = (long)in_stack_00000010[0x10] * (long)in_stack_00000018[-0xf] + local_110;
        case 0x10:
          local_110 = (long)in_stack_00000010[0xf] * (long)in_stack_00000018[-0xe] + local_110;
        case 0xf:
          local_110 = (long)in_stack_00000010[0xe] * (long)in_stack_00000018[-0xd] + local_110;
        case 0xe:
          local_110 = (long)in_stack_00000010[0xd] * (long)in_stack_00000018[-0xc] + local_110;
        case 0xd:
          local_110 = (long)in_stack_00000010[0xc] * (long)in_stack_00000018[-0xb] + local_110;
        case 0xc:
          local_110 = (long)in_stack_00000010[0xb] * (long)in_stack_00000018[-10] + local_110;
        case 0xb:
          local_110 = (long)in_stack_00000010[10] * (long)in_stack_00000018[-9] + local_110;
        case 10:
          local_110 = (long)in_stack_00000010[9] * (long)in_stack_00000018[-8] + local_110;
        case 9:
          local_110 = (long)in_stack_00000010[8] * (long)in_stack_00000018[-7] + local_110;
        case 8:
          local_110 = (long)in_stack_00000010[7] * (long)in_stack_00000018[-6] + local_110;
        case 7:
          local_110 = (long)in_stack_00000010[6] * (long)in_stack_00000018[-5] + local_110;
        case 6:
          local_110 = (long)in_stack_00000010[5] * (long)in_stack_00000018[-4] + local_110;
        case 5:
          local_110 = (long)in_stack_00000010[4] * (long)in_stack_00000018[-3] + local_110;
        case 4:
          local_110 = (long)in_stack_00000010[3] * (long)in_stack_00000018[-2] + local_110;
        case 3:
          local_110 = (long)in_stack_00000010[2] * (long)in_stack_00000018[-1] + local_110;
        case 2:
          local_110 = (long)in_stack_00000010[1] * (long)*in_stack_00000018 + local_110;
        case 1:
          local_110 = (long)*in_stack_00000010 * (long)in_stack_00000018[1] + local_110;
        }
        in_stack_00000018[2] = local_1170 + (int)(local_110 >> (local_b4 & 0x3f));
        local_130 = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_130 = (long)in_stack_00000010[0x1f] * (long)in_stack_00000018[-0x1d];
        case 0x1f:
          local_130 = (long)in_stack_00000010[0x1e] * (long)in_stack_00000018[-0x1c] + local_130;
        case 0x1e:
          local_130 = (long)in_stack_00000010[0x1d] * (long)in_stack_00000018[-0x1b] + local_130;
        case 0x1d:
          local_130 = (long)in_stack_00000010[0x1c] * (long)in_stack_00000018[-0x1a] + local_130;
        case 0x1c:
          local_130 = (long)in_stack_00000010[0x1b] * (long)in_stack_00000018[-0x19] + local_130;
        case 0x1b:
          local_130 = (long)in_stack_00000010[0x1a] * (long)in_stack_00000018[-0x18] + local_130;
        case 0x1a:
          local_130 = (long)in_stack_00000010[0x19] * (long)in_stack_00000018[-0x17] + local_130;
        case 0x19:
          local_130 = (long)in_stack_00000010[0x18] * (long)in_stack_00000018[-0x16] + local_130;
        case 0x18:
          local_130 = (long)in_stack_00000010[0x17] * (long)in_stack_00000018[-0x15] + local_130;
        case 0x17:
          local_130 = (long)in_stack_00000010[0x16] * (long)in_stack_00000018[-0x14] + local_130;
        case 0x16:
          local_130 = (long)in_stack_00000010[0x15] * (long)in_stack_00000018[-0x13] + local_130;
        case 0x15:
          local_130 = (long)in_stack_00000010[0x14] * (long)in_stack_00000018[-0x12] + local_130;
        case 0x14:
          local_130 = (long)in_stack_00000010[0x13] * (long)in_stack_00000018[-0x11] + local_130;
        case 0x13:
          local_130 = (long)in_stack_00000010[0x12] * (long)in_stack_00000018[-0x10] + local_130;
        case 0x12:
          local_130 = (long)in_stack_00000010[0x11] * (long)in_stack_00000018[-0xf] + local_130;
        case 0x11:
          local_130 = (long)in_stack_00000010[0x10] * (long)in_stack_00000018[-0xe] + local_130;
        case 0x10:
          local_130 = (long)in_stack_00000010[0xf] * (long)in_stack_00000018[-0xd] + local_130;
        case 0xf:
          local_130 = (long)in_stack_00000010[0xe] * (long)in_stack_00000018[-0xc] + local_130;
        case 0xe:
          local_130 = (long)in_stack_00000010[0xd] * (long)in_stack_00000018[-0xb] + local_130;
        case 0xd:
          local_130 = (long)in_stack_00000010[0xc] * (long)in_stack_00000018[-10] + local_130;
        case 0xc:
          local_130 = (long)in_stack_00000010[0xb] * (long)in_stack_00000018[-9] + local_130;
        case 0xb:
          local_130 = (long)in_stack_00000010[10] * (long)in_stack_00000018[-8] + local_130;
        case 10:
          local_130 = (long)in_stack_00000010[9] * (long)in_stack_00000018[-7] + local_130;
        case 9:
          local_130 = (long)in_stack_00000010[8] * (long)in_stack_00000018[-6] + local_130;
        case 8:
          local_130 = (long)in_stack_00000010[7] * (long)in_stack_00000018[-5] + local_130;
        case 7:
          local_130 = (long)in_stack_00000010[6] * (long)in_stack_00000018[-4] + local_130;
        case 6:
          local_130 = (long)in_stack_00000010[5] * (long)in_stack_00000018[-3] + local_130;
        case 5:
          local_130 = (long)in_stack_00000010[4] * (long)in_stack_00000018[-2] + local_130;
        case 4:
          local_130 = (long)in_stack_00000010[3] * (long)in_stack_00000018[-1] + local_130;
        case 3:
          local_130 = (long)in_stack_00000010[2] * (long)*in_stack_00000018 + local_130;
        case 2:
          local_130 = (long)in_stack_00000010[1] * (long)in_stack_00000018[1] + local_130;
        case 1:
          local_130 = (long)*in_stack_00000010 * (long)in_stack_00000018[2] + local_130;
        default:
          in_stack_00000018[3] = local_1174 + (int)(local_130 >> (local_b4 & 0x3f));
          in_stack_00000018 = in_stack_00000018 + 4;
        }
      }
    }
    for (local_1184 = local_1140 & 0xfffffffc; local_1184 < local_1140; local_1184 = local_1184 + 1)
    {
      local_10c8 = local_1138;
      local_10c9 = local_1141;
      local_10d8 = &local_1158;
      local_10e0 = &local_1168;
      local_10e4 = local_1141 + 1;
      local_10e8 = 0x40 - local_10e4;
      local_10ec = 0x40 - local_10e4;
      local_10f8 = *(ulong *)(local_1138 + 0x1030);
      local_10fc = *(int *)(local_1138 + 0x2c);
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (local_10f8 == 0) {
          local_f68 = 0x40;
        }
        else {
          local_f74 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                              (local_10f8 >> 0x3c) * 4);
          if (local_f74 == 0) {
            local_f74 = 0;
            local_f70 = local_10f8;
            if ((local_10f8 & 0xffffffff00000000) == 0) {
              local_f74 = 0x20;
              local_f70 = local_10f8 << 0x20;
            }
            if ((local_f70 & 0xffff000000000000) == 0) {
              local_f74 = local_f74 + 0x10;
              local_f70 = local_f70 << 0x10;
            }
            if ((local_f70 & 0xff00000000000000) == 0) {
              local_f74 = local_f74 + 8;
              local_f70 = local_f70 << 8;
            }
            if ((local_f70 & 0xf000000000000000) == 0) {
              local_f74 = local_f74 + 4;
              local_f70 = local_f70 << 4;
            }
            local_f74 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (local_f70 >> 0x3c) * 4) + local_f74;
          }
          local_f68 = local_f74 - 1;
        }
        local_106c = local_f68;
      }
      else {
        local_106c = (uint)LZCOUNT(local_10f8);
      }
      local_1100 = local_106c;
      if (local_106c < 0x40) {
        local_1158 = local_106c;
      }
      else {
        local_1110 = 0x40 - local_10fc;
        do {
          if (*(uint *)(local_10c8 + 0x28) < 0x200) {
            if (*(int *)(local_10c8 + 0x1048) == 0) {
              uVar1 = *(undefined8 *)(local_10c8 + 0x1040);
              *(ma_uint16 *)(local_10c8 + 0x1038) =
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (local_10c8 + 0x1038)
                                                                 >> 8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                    0x38))] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                         (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                   ma_dr_flac__crc16_table
                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                              [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                         [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (local_10c8 + 0x1038)
                                                                 >> 8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                    0x38))] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                        [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (local_10c8 +
                                                                                      0x1038) << 8 ^
                                                                                                                                                                        
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (local_10c8 + 0x1038)
                                                                 >> 8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                    0x38))] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                         (uint)(byte)uVar1)];
            }
            else {
              local_101a = *(ushort *)(local_10c8 + 0x1038);
              uVar1 = *(undefined8 *)(local_10c8 + 0x1040);
              switch(-*(int *)(local_10c8 + 0x1048)) {
              case 0:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))
                             ];
              case -1:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))
                             ];
              case -2:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))
                             ];
              case -3:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))
                             ];
              case -4:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))
                             ];
              case -5:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))
                             ];
              case -6:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
              case -7:
                local_101a = local_101a << 8 ^
                             ma_dr_flac__crc16_table
                             [(int)((int)(uint)local_101a >> 8 ^ (uint)(byte)uVar1)];
              default:
                *(ushort *)(local_10c8 + 0x1038) = local_101a;
                *(undefined4 *)(local_10c8 + 0x1048) = 0;
              }
            }
            uVar7 = *(uint *)(local_10c8 + 0x28);
            *(uint *)(local_10c8 + 0x28) = uVar7 + 1;
            uVar12 = *(ulong *)(local_10c8 + 0x30 + (ulong)uVar7 * 8);
            local_10f8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                         (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                         (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
            local_10fc = 0;
            *(ulong *)(local_10c8 + 0x1040) = local_10f8;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
            if (mVar6 == 0) {
              bVar14 = false;
              goto LAB_00289c54;
            }
            local_10f8 = *(ulong *)(local_10c8 + 0x1030);
            local_10fc = *(int *)(local_10c8 + 0x2c);
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            local_f60 = local_10f8;
            if (local_10f8 == 0) {
              local_f54 = 0x40;
            }
            else {
              local_f64 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (local_10f8 >> 0x3c) * 4);
              if (local_f64 == 0) {
                local_f64 = 0;
                if ((local_10f8 & 0xffffffff00000000) == 0) {
                  local_f64 = 0x20;
                  local_f60 = local_10f8 << 0x20;
                }
                if ((local_f60 & 0xffff000000000000) == 0) {
                  local_f64 = local_f64 + 0x10;
                  local_f60 = local_f60 << 0x10;
                }
                if ((local_f60 & 0xff00000000000000) == 0) {
                  local_f64 = local_f64 + 8;
                  local_f60 = local_f60 << 8;
                }
                if ((local_f60 & 0xf000000000000000) == 0) {
                  local_f64 = local_f64 + 4;
                  local_f60 = local_f60 << 4;
                }
                local_f64 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (local_f60 >> 0x3c) * 4) + local_f64;
              }
              local_f54 = local_f64 - 1;
            }
            local_107c = local_f54;
          }
          else {
            local_107c = (uint)LZCOUNT(local_10f8);
          }
          local_1100 = local_107c;
          local_1110 = local_107c + local_1110;
        } while (0x3f < local_107c);
        *local_10d8 = local_1110;
      }
      local_10f8 = local_10f8 << ((byte)local_1100 & 0x3f);
      local_10fc = local_1100 + local_10fc;
      if (local_10ec < local_10fc) {
        local_1104 = (uint)(local_10f8 >> ((byte)local_10e8 & 0x3f));
        local_110c = local_10fc - local_10ec;
        if (*(uint *)(local_10c8 + 0x28) < 0x200) {
          if (*(int *)(local_10c8 + 0x1048) == 0) {
            uVar1 = *(undefined8 *)(local_10c8 + 0x1040);
            *(ma_uint16 *)(local_10c8 + 0x1038) =
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                            [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                       [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                      [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (local_10c8 + 0x1038)
                                                                 >> 8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                    0x38))] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                 (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                       (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                            [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                       [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (local_10c8 + 0x1038)
                                                                 >> 8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                    0x38))] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                      [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (local_10c8 +
                                                                                      0x1038) << 8 ^
                                                                                                                                                                        
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  << 8 ^ ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (local_10c8 + 0x1038)
                                                                 >> 8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                    0x38))] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (local_10c8 +
                                                                                     0x1038) << 8 ^
                                                                                                                                                                      
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(local_10c8 + 0x1038) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (local_10c8 + 0x1038) >>
                                                                8 ^ (uint)(byte)((ulong)uVar1 >>
                                                                                0x38))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(local_10c8 + 0x1038) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (local_10c8 + 0x1038)
                                                                             << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(local_10c8 + 0x1038)
                                                         >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))]
                                                  ) >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >>
                                                  8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                 (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                       (uint)(byte)uVar1)];
          }
          else {
            local_102e = *(ushort *)(local_10c8 + 0x1038);
            uVar1 = *(undefined8 *)(local_10c8 + 0x1040);
            switch(-*(int *)(local_10c8 + 0x1048)) {
            case 0:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
            case -1:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
            case -2:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
            case -3:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
            case -4:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
            case -5:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
            case -6:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
            case -7:
              local_102e = local_102e << 8 ^
                           ma_dr_flac__crc16_table
                           [(int)((int)(uint)local_102e >> 8 ^ (uint)(byte)uVar1)];
            default:
              *(ushort *)(local_10c8 + 0x1038) = local_102e;
              *(undefined4 *)(local_10c8 + 0x1048) = 0;
            }
          }
          uVar7 = *(uint *)(local_10c8 + 0x28);
          *(uint *)(local_10c8 + 0x28) = uVar7 + 1;
          uVar12 = *(ulong *)(local_10c8 + 0x30 + (ulong)uVar7 * 8);
          local_10f8 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                       (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                       (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                       (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
          local_10fc = local_10fc - local_10ec;
          *(ulong *)(local_10c8 + 0x1040) = local_10f8;
LAB_00289179:
          local_1108 = (uint)(local_10f8 >> (0x40U - (char)local_110c & 0x3f));
          *local_10e0 = local_1104 | local_1108;
          local_10f8 = local_10f8 << ((byte)local_110c & 0x3f);
          goto LAB_002891d0;
        }
        mVar6 = ma_dr_flac__reload_cache(in_stack_ffffffffffffed30);
        if (mVar6 == 0) {
          bVar14 = false;
        }
        else {
          if ((ulong)local_110c <= 0x40 - (ulong)*(uint *)(local_10c8 + 0x2c)) {
            local_10f8 = *(ulong *)(local_10c8 + 0x1030);
            local_10fc = *(int *)(local_10c8 + 0x2c) + local_110c;
            goto LAB_00289179;
          }
          bVar14 = false;
        }
      }
      else {
        *local_10e0 = (uint)(local_10f8 >> ((byte)local_10e8 & 0x3f));
        local_10f8 = local_10f8 << ((byte)local_10e4 & 0x3f);
        local_10fc = local_10e4 + local_10fc;
LAB_002891d0:
        *(ulong *)(local_10c8 + 0x1030) = local_10f8;
        *(uint *)(local_10c8 + 0x2c) = local_10fc;
        bVar14 = true;
      }
LAB_00289c54:
      if (!bVar14) {
        return 0;
      }
      uVar7 = local_1158 << (local_1141 & 0x1f) | uVar4 & local_1168;
      local_1168 = uVar7 >> 1 ^ local_1154[uVar7 & 1];
      local_1120 = local_113c;
      local_1124 = local_1154[3];
      local_8 = 0;
      for (local_4 = local_1154[3]; local_4 != 0; local_4 = local_4 >> 1) {
        local_8 = local_8 + 1;
      }
      if ((uint)(local_113c + in_stack_00000008 + local_8) < 0x21) {
        local_ac = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_ac = in_stack_00000010[0x1f] * in_stack_00000018[-0x20];
        case 0x1f:
          local_ac = in_stack_00000010[0x1e] * in_stack_00000018[-0x1f] + local_ac;
        case 0x1e:
          local_ac = in_stack_00000010[0x1d] * in_stack_00000018[-0x1e] + local_ac;
        case 0x1d:
          local_ac = in_stack_00000010[0x1c] * in_stack_00000018[-0x1d] + local_ac;
        case 0x1c:
          local_ac = in_stack_00000010[0x1b] * in_stack_00000018[-0x1c] + local_ac;
        case 0x1b:
          local_ac = in_stack_00000010[0x1a] * in_stack_00000018[-0x1b] + local_ac;
        case 0x1a:
          local_ac = in_stack_00000010[0x19] * in_stack_00000018[-0x1a] + local_ac;
        case 0x19:
          local_ac = in_stack_00000010[0x18] * in_stack_00000018[-0x19] + local_ac;
        case 0x18:
          local_ac = in_stack_00000010[0x17] * in_stack_00000018[-0x18] + local_ac;
        case 0x17:
          local_ac = in_stack_00000010[0x16] * in_stack_00000018[-0x17] + local_ac;
        case 0x16:
          local_ac = in_stack_00000010[0x15] * in_stack_00000018[-0x16] + local_ac;
        case 0x15:
          local_ac = in_stack_00000010[0x14] * in_stack_00000018[-0x15] + local_ac;
        case 0x14:
          local_ac = in_stack_00000010[0x13] * in_stack_00000018[-0x14] + local_ac;
        case 0x13:
          local_ac = in_stack_00000010[0x12] * in_stack_00000018[-0x13] + local_ac;
        case 0x12:
          local_ac = in_stack_00000010[0x11] * in_stack_00000018[-0x12] + local_ac;
        case 0x11:
          local_ac = in_stack_00000010[0x10] * in_stack_00000018[-0x11] + local_ac;
        case 0x10:
          local_ac = in_stack_00000010[0xf] * in_stack_00000018[-0x10] + local_ac;
        case 0xf:
          local_ac = in_stack_00000010[0xe] * in_stack_00000018[-0xf] + local_ac;
        case 0xe:
          local_ac = in_stack_00000010[0xd] * in_stack_00000018[-0xe] + local_ac;
        case 0xd:
          local_ac = in_stack_00000010[0xc] * in_stack_00000018[-0xd] + local_ac;
        case 0xc:
          local_ac = in_stack_00000010[0xb] * in_stack_00000018[-0xc] + local_ac;
        case 0xb:
          local_ac = in_stack_00000010[10] * in_stack_00000018[-0xb] + local_ac;
        case 10:
          local_ac = in_stack_00000010[9] * in_stack_00000018[-10] + local_ac;
        case 9:
          local_ac = in_stack_00000010[8] * in_stack_00000018[-9] + local_ac;
        case 8:
          local_ac = in_stack_00000010[7] * in_stack_00000018[-8] + local_ac;
        case 7:
          local_ac = in_stack_00000010[6] * in_stack_00000018[-7] + local_ac;
        case 6:
          local_ac = in_stack_00000010[5] * in_stack_00000018[-6] + local_ac;
        case 5:
          local_ac = in_stack_00000010[4] * in_stack_00000018[-5] + local_ac;
        case 4:
          local_ac = in_stack_00000010[3] * in_stack_00000018[-4] + local_ac;
        case 3:
          local_ac = in_stack_00000010[2] * in_stack_00000018[-3] + local_ac;
        case 2:
          local_ac = in_stack_00000010[1] * in_stack_00000018[-2] + local_ac;
        case 1:
          local_ac = *in_stack_00000010 * in_stack_00000018[-1] + local_ac;
        default:
          *in_stack_00000018 = local_1168 + (local_ac >> ((byte)local_1154[2] & 0x1f));
        }
      }
      else {
        local_150 = 0;
        switch(local_1154[3]) {
        case 0x20:
          local_150 = (long)in_stack_00000010[0x1f] * (long)in_stack_00000018[-0x20];
        case 0x1f:
          local_150 = (long)in_stack_00000010[0x1e] * (long)in_stack_00000018[-0x1f] + local_150;
        case 0x1e:
          local_150 = (long)in_stack_00000010[0x1d] * (long)in_stack_00000018[-0x1e] + local_150;
        case 0x1d:
          local_150 = (long)in_stack_00000010[0x1c] * (long)in_stack_00000018[-0x1d] + local_150;
        case 0x1c:
          local_150 = (long)in_stack_00000010[0x1b] * (long)in_stack_00000018[-0x1c] + local_150;
        case 0x1b:
          local_150 = (long)in_stack_00000010[0x1a] * (long)in_stack_00000018[-0x1b] + local_150;
        case 0x1a:
          local_150 = (long)in_stack_00000010[0x19] * (long)in_stack_00000018[-0x1a] + local_150;
        case 0x19:
          local_150 = (long)in_stack_00000010[0x18] * (long)in_stack_00000018[-0x19] + local_150;
        case 0x18:
          local_150 = (long)in_stack_00000010[0x17] * (long)in_stack_00000018[-0x18] + local_150;
        case 0x17:
          local_150 = (long)in_stack_00000010[0x16] * (long)in_stack_00000018[-0x17] + local_150;
        case 0x16:
          local_150 = (long)in_stack_00000010[0x15] * (long)in_stack_00000018[-0x16] + local_150;
        case 0x15:
          local_150 = (long)in_stack_00000010[0x14] * (long)in_stack_00000018[-0x15] + local_150;
        case 0x14:
          local_150 = (long)in_stack_00000010[0x13] * (long)in_stack_00000018[-0x14] + local_150;
        case 0x13:
          local_150 = (long)in_stack_00000010[0x12] * (long)in_stack_00000018[-0x13] + local_150;
        case 0x12:
          local_150 = (long)in_stack_00000010[0x11] * (long)in_stack_00000018[-0x12] + local_150;
        case 0x11:
          local_150 = (long)in_stack_00000010[0x10] * (long)in_stack_00000018[-0x11] + local_150;
        case 0x10:
          local_150 = (long)in_stack_00000010[0xf] * (long)in_stack_00000018[-0x10] + local_150;
        case 0xf:
          local_150 = (long)in_stack_00000010[0xe] * (long)in_stack_00000018[-0xf] + local_150;
        case 0xe:
          local_150 = (long)in_stack_00000010[0xd] * (long)in_stack_00000018[-0xe] + local_150;
        case 0xd:
          local_150 = (long)in_stack_00000010[0xc] * (long)in_stack_00000018[-0xd] + local_150;
        case 0xc:
          local_150 = (long)in_stack_00000010[0xb] * (long)in_stack_00000018[-0xc] + local_150;
        case 0xb:
          local_150 = (long)in_stack_00000010[10] * (long)in_stack_00000018[-0xb] + local_150;
        case 10:
          local_150 = (long)in_stack_00000010[9] * (long)in_stack_00000018[-10] + local_150;
        case 9:
          local_150 = (long)in_stack_00000010[8] * (long)in_stack_00000018[-9] + local_150;
        case 8:
          local_150 = (long)in_stack_00000010[7] * (long)in_stack_00000018[-8] + local_150;
        case 7:
          local_150 = (long)in_stack_00000010[6] * (long)in_stack_00000018[-7] + local_150;
        case 6:
          local_150 = (long)in_stack_00000010[5] * (long)in_stack_00000018[-6] + local_150;
        case 5:
          local_150 = (long)in_stack_00000010[4] * (long)in_stack_00000018[-5] + local_150;
        case 4:
          local_150 = (long)in_stack_00000010[3] * (long)in_stack_00000018[-4] + local_150;
        case 3:
          local_150 = (long)in_stack_00000010[2] * (long)in_stack_00000018[-3] + local_150;
        case 2:
          local_150 = (long)in_stack_00000010[1] * (long)in_stack_00000018[-2] + local_150;
        case 1:
          local_150 = (long)*in_stack_00000010 * (long)in_stack_00000018[-1] + local_150;
        default:
          *in_stack_00000018 = local_1168 + (int)(local_150 >> ((byte)local_1154[2] & 0x3f));
        }
      }
      in_stack_00000018 = in_stack_00000018 + 1;
    }
    local_112c = 1;
  }
  return local_112c;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 count, ma_uint8 riceParam, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pSamplesOut)
{
    ma_uint32 t[2] = {0x00000000, 0xFFFFFFFF};
    ma_uint32 zeroCountPart0 = 0;
    ma_uint32 zeroCountPart1 = 0;
    ma_uint32 zeroCountPart2 = 0;
    ma_uint32 zeroCountPart3 = 0;
    ma_uint32 riceParamPart0 = 0;
    ma_uint32 riceParamPart1 = 0;
    ma_uint32 riceParamPart2 = 0;
    ma_uint32 riceParamPart3 = 0;
    ma_uint32 riceParamMask;
    const ma_int32* pSamplesOutEnd;
    ma_uint32 i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pSamplesOut != NULL);
    if (lpcOrder == 0) {
        return ma_dr_flac__decode_samples_with_residual__rice__scalar_zeroorder(bs, bitsPerSample, count, riceParam, lpcOrder, lpcShift, coefficients, pSamplesOut);
    }
    riceParamMask  = (ma_uint32)~((~0UL) << riceParam);
    pSamplesOutEnd = pSamplesOut + (count & ~3);
    if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    } else {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    }
    i = (count & ~3);
    while (i < count) {
        if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0)) {
            return MA_FALSE;
        }
        riceParamPart0 &= riceParamMask;
        riceParamPart0 |= (zeroCountPart0 << riceParam);
        riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
        if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        } else {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        }
        i += 1;
        pSamplesOut += 1;
    }
    return MA_TRUE;
}